

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_physical_device_features
          (Impl *this,void *device_pnext,ScratchAllocator *alloc,VkPhysicalDeviceFeatures2 **out_pdf
          )

{
  bool bVar1;
  int *__src;
  Impl *__dest;
  Impl *this_00;
  
  for (__src = (int *)device_pnext; __src != (int *)0x0; __src = *(int **)(__src + 2)) {
    if (*__src == 0x3b9bb078) goto LAB_00129942;
  }
  __src = (int *)0x0;
LAB_00129942:
  if (__src == (int *)0x0) {
    bVar1 = false;
  }
  else {
    this_00 = (Impl *)alloc;
    __dest = (Impl *)ScratchAllocator::allocate_raw(alloc,0xf0,0x10);
    if (__dest != (Impl *)0x0) {
      this_00 = __dest;
      memmove(__dest,__src,0xf0);
    }
    (__dest->temp_allocator).impl = (Impl *)0x0;
    bVar1 = copy_pnext_chain_pdf2(this_00,device_pnext,alloc,&(__dest->temp_allocator).impl);
    if (bVar1) {
      *out_pdf = (VkPhysicalDeviceFeatures2 *)__dest;
    }
  }
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::copy_physical_device_features(const void *device_pnext,
                                                        ScratchAllocator &alloc,
                                                        VkPhysicalDeviceFeatures2 **out_pdf)
{
	// Reorder so that PDF2 comes first in the chain.
	// Caller guarantees that PDF2 is part of the device_pnext.
	// If original application did not have PDF2, just synthesize one based on pEnabledFeatures instead.
	const auto *pdf = find_pnext<VkPhysicalDeviceFeatures2>(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2,
	                                                        device_pnext);

	if (!pdf)
		return false;

	auto *features = copy(pdf, 1, alloc);
	features->pNext = nullptr;

	if (!copy_pnext_chain_pdf2(device_pnext, alloc, &features->pNext))
		return false;

	*out_pdf = features;
	return true;
}